

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int evsig_del(event_base *base,int evsignal,short old,short events,void *p)

{
  int iVar1;
  bool local_21;
  void *p_local;
  short events_local;
  short old_local;
  int evsignal_local;
  event_base *base_local;
  
  local_21 = 0x40 < (uint)evsignal;
  if (local_21) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/signal.c"
               ,0x16d,"evsignal >= 0 && evsignal < NSIG","evsig_del");
  }
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("%s: %d: restoring signal handler","evsig_del",(ulong)(uint)evsignal);
  }
  if (evsig_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,evsig_base_lock);
  }
  evsig_base_n_signals_added = evsig_base_n_signals_added + -1;
  (base->sig).ev_n_signals_added = (base->sig).ev_n_signals_added + -1;
  if (evsig_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,evsig_base_lock);
  }
  iVar1 = evsig_restore_handler_(base,evsignal);
  return iVar1;
}

Assistant:

static int
evsig_del(struct event_base *base, evutil_socket_t evsignal, short old, short events, void *p)
{
	EVUTIL_ASSERT(evsignal >= 0 && evsignal < NSIG);

	event_debug(("%s: "EV_SOCK_FMT": restoring signal handler",
		__func__, EV_SOCK_ARG(evsignal)));

	EVSIGBASE_LOCK();
	--evsig_base_n_signals_added;
	--base->sig.ev_n_signals_added;
	EVSIGBASE_UNLOCK();

	return (evsig_restore_handler_(base, (int)evsignal));
}